

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>_>::~SizeIsMatcher
          (SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>_> *this)

{
  SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>_> *this_local;
  
  ~SizeIsMatcher(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

class SizeIsMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit SizeIsMatcher(const T& expected) : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Size is: " << m_expected;
        return strm.str();
    }